

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

FString __thiscall FString::Mid(FString *this,size_t pos,size_t numChars)

{
  long lVar1;
  ulong uVar2;
  FStringData *pFVar3;
  ulong in_RCX;
  ulong uVar4;
  ulong strlen;
  FStringData *__dest;
  
  lVar1 = *(long *)pos;
  uVar4 = (ulong)*(uint *)(lVar1 + -0xc);
  uVar2 = uVar4 - numChars;
  if (uVar4 < numChars || uVar2 == 0) {
    NullString.RefCount = NullString.RefCount + 1;
    __dest = (FStringData *)NullString.Nothing;
  }
  else {
    strlen = in_RCX;
    if (uVar4 < in_RCX + numChars) {
      strlen = uVar2;
    }
    if (CARRY8(in_RCX,numChars)) {
      strlen = uVar2;
    }
    pFVar3 = FStringData::Alloc(strlen);
    __dest = pFVar3 + 1;
    pFVar3->Len = (uint)strlen;
    memcpy(__dest,(void *)(lVar1 + numChars),strlen);
    *(undefined1 *)((long)&pFVar3[1].Len + strlen) = 0;
  }
  this->Chars = (char *)__dest;
  return (FString)(char *)this;
}

Assistant:

FString FString::Mid (size_t pos, size_t numChars) const
{
	size_t len = Len();
	if (pos >= len)
	{
		return FString();
	}
	if (pos + numChars > len || pos + numChars < pos)
	{
		numChars = len - pos;
	}
	return FString (Chars + pos, numChars);
}